

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripemd.cc
# Opt level: O0

int RIPEMD160_Init(RIPEMD160_CTX *c)

{
  RIPEMD160_CTX *ctx_local;
  
  OPENSSL_memset(c,0,0x60);
  c->A = 0x67452301;
  c->B = 0xefcdab89;
  c->C = 0x98badcfe;
  c->D = 0x10325476;
  c->E = 0xc3d2e1f0;
  return 1;
}

Assistant:

int RIPEMD160_Init(RIPEMD160_CTX *ctx) {
  OPENSSL_memset(ctx, 0, sizeof(*ctx));
  ctx->h[0] = RIPEMD160_A;
  ctx->h[1] = RIPEMD160_B;
  ctx->h[2] = RIPEMD160_C;
  ctx->h[3] = RIPEMD160_D;
  ctx->h[4] = RIPEMD160_E;
  return 1;
}